

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O0

void Fossilize::Instance::braceForRayTracingPipelineCrash
               (StateRecorder *recorder,VkRayTracingPipelineCreateInfoKHR *info)

{
  long lVar1;
  VkRayTracingPipelineCreateInfoKHR *info_local;
  StateRecorder *recorder_local;
  
  lVar1 = __tls_get_addr(&PTR_00244fb0);
  *(StateRecorder **)(lVar1 + 8) = recorder;
  lVar1 = __tls_get_addr(&PTR_00244fb0);
  *(undefined8 *)(lVar1 + 0x18) = 0;
  lVar1 = __tls_get_addr(&PTR_00244fb0);
  *(undefined8 *)(lVar1 + 0x10) = 0;
  lVar1 = __tls_get_addr(&PTR_00244fb0);
  *(VkRayTracingPipelineCreateInfoKHR **)(lVar1 + 0x20) = info;
  return;
}

Assistant:

void Instance::braceForRayTracingPipelineCrash(StateRecorder *recorder,
                                               const VkRayTracingPipelineCreateInfoKHR *info)
{
#ifdef FOSSILIZE_LAYER_CAPTURE_SIGSEGV
	tls_recorder = recorder;
	tls_compute_create_info = nullptr;
	tls_graphics_create_info = nullptr;
	tls_raytracing_create_info = info;
#else
	(void)recorder;
	(void)info;
#endif
}